

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessComputeShaderArguments
          (ConversionStream *this,iterator *TypeToken,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *GlobalVariables,String *Prologue)

{
  anon_class_16_2_002f3f82 ArgHandler;
  String *this_00;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  pointer pHVar4;
  pointer pHVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff928;
  string *local_6a0;
  bool local_649;
  char *local_648;
  string *local_628;
  bool local_61b;
  string local_610 [32];
  string local_5f0 [32];
  ConversionStream *local_5d0;
  stringstream *psStack_5c8;
  reference local_5c0;
  ShaderParameterInfo *Param;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *__range1;
  const_iterator local_598;
  const_iterator local_590;
  String local_588;
  undefined1 local_568 [8];
  string err_5;
  char *local_540;
  Char *ExpectedLiteral;
  undefined1 local_518 [8];
  string err_4;
  int local_4ec;
  string local_4e8 [4];
  int i;
  String CSGroupSize [3];
  undefined1 local_468 [8];
  string err_3;
  String local_440;
  undefined1 local_420 [8];
  string err_2;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_3f8;
  iterator OpenStapleToken;
  undefined1 local_3d0 [8];
  string err_1;
  _Self local_3a8;
  String local_3a0;
  undefined1 local_380 [8];
  string err;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_358;
  iterator Token;
  stringstream local_340 [8];
  stringstream PrologueSS;
  stringstream local_1b8 [8];
  stringstream GlobalVarsSS;
  ostream local_1a8 [376];
  String *local_30;
  String *Prologue_local;
  String *GlobalVariables_local;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *Params_local;
  iterator *TypeToken_local;
  ConversionStream *this_local;
  
  local_30 = Prologue;
  Prologue_local = GlobalVariables;
  GlobalVariables_local = (String *)Params;
  Params_local = (vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  *)TypeToken;
  TypeToken_local = (iterator *)this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  local_358._M_node =
       (_List_node_base *)
       (Params_local->
       super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
       )._M_impl.super__Vector_impl_data._M_start;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--(&local_358);
  err.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       begin(&this->m_Tokens);
  bVar1 = std::operator!=(&local_358,(_Self *)((long)&err.field_2 + 8));
  bVar2 = false;
  if (bVar1) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_358);
    bVar2 = pHVar4->Type == ClosingSquareBracket;
  }
  if (!bVar2) {
    FormatString<char[31]>((string *)local_380,(char (*) [31])"Missing numthreads declaration");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_3a0,this,&local_358,4);
    in_stack_fffffffffffff928 = &local_3a0;
    Prologue = (String *)local_380;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcac,Prologue,(char (*) [2])0x46b1a3,in_stack_fffffffffffff928);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)local_380);
  }
  while( true ) {
    local_3a8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         begin(&this->m_Tokens);
    bVar1 = std::operator!=(&local_358,&local_3a8);
    bVar2 = false;
    if (bVar1) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_358);
      bVar2 = pHVar4->Type != OpenSquareBracket;
    }
    if (!bVar2) break;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--(&local_358);
  }
  err_1.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       begin(&this->m_Tokens);
  bVar2 = std::operator!=(&local_358,(_Self *)((long)&err_1.field_2 + 8));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    FormatString<char[33]>((string *)local_3d0,(char (*) [33])"Missing numthreads() declaration");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&OpenStapleToken,this,&local_358,4);
    in_stack_fffffffffffff928 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&OpenStapleToken;
    Prologue = (String *)local_3d0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcb2,Prologue,(char (*) [2])0x46b1a3,in_stack_fffffffffffff928);
    std::__cxx11::string::~string((string *)&OpenStapleToken);
    std::__cxx11::string::~string((string *)local_3d0);
  }
  local_3f8._M_node = local_358._M_node;
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_358);
  err_2.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar2 = std::operator!=(&local_358,(_Self *)((long)&err_2.field_2 + 8));
  local_61b = false;
  if (bVar2) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_358);
    local_61b = false;
    if (pHVar4->Type == Identifier) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_358);
      local_61b = std::operator==(&pHVar4->Literal,"numthreads");
    }
  }
  if (((local_61b ^ 0xffU) & 1) != 0) {
    FormatString<char[33]>((string *)local_420,(char (*) [33])"Missing numthreads() declaration");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_440,this,&local_358,4);
    in_stack_fffffffffffff928 = &local_440;
    Prologue = (String *)local_420;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcb9,Prologue,(char (*) [2])0x46b1a3,in_stack_fffffffffffff928);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)local_420);
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_358);
  err_3.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(&local_358,(_Self *)((long)&err_3.field_2 + 8));
  bVar2 = false;
  if (bVar1) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_358);
    bVar2 = pHVar4->Type == OpenParen;
  }
  if (!bVar2) {
    FormatString<char[29]>((string *)local_468,(char (*) [29])"Missing \'(\' after numthreads");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)((long)&CSGroupSize[2].field_2 + 8),this,&local_358,4);
    in_stack_fffffffffffff928 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&CSGroupSize[2].field_2 + 8);
    Prologue = (String *)local_468;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcbf,Prologue,(char (*) [2])0x46b1a3,in_stack_fffffffffffff928);
    std::__cxx11::string::~string((string *)(CSGroupSize[2].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_468);
  }
  local_628 = local_4e8;
  do {
    std::__cxx11::string::string(local_628);
    local_628 = local_628 + 0x20;
  } while (local_628 != (string *)((long)&CSGroupSize[2].field_2 + 8));
  for (local_4ec = 0; local_4ec < 3; local_4ec = local_4ec + 1) {
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_358);
    err_4.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar1 = std::operator!=(&local_358,(_Self *)((long)&err_4.field_2 + 8));
    bVar2 = false;
    if (bVar1) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_358);
      bVar2 = true;
      if (pHVar4->Type != NumericConstant) {
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_358);
        bVar2 = pHVar4->Type == Identifier;
      }
    }
    if (!bVar2) {
      FormatString<char[24],char_const*,char[11]>
                ((string *)local_518,(Diligent *)"Missing group size for ",
                 (char (*) [24])(ProcessComputeShaderArguments::DirNames + local_4ec),
                 (char **)" direction",(char (*) [11])Prologue);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)&ExpectedLiteral,this,&local_358,4);
      in_stack_fffffffffffff928 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ExpectedLiteral;
      Prologue = (String *)local_518;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcc9,Prologue,(char (*) [2])0x46b1a3,in_stack_fffffffffffff928);
      std::__cxx11::string::~string((string *)&ExpectedLiteral);
      std::__cxx11::string::~string((string *)local_518);
    }
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_358);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=(local_4e8 + (long)local_4ec * 0x20,pcVar3);
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_358);
    if (local_4ec < 2) {
      local_648 = ",";
    }
    else {
      local_648 = ")";
    }
    local_540 = local_648;
    err_5.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator!=(&local_358,(_Self *)((long)&err_5.field_2 + 8));
    local_649 = false;
    if (bVar2) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_358);
      local_649 = std::operator==(&pHVar4->Literal,local_540);
    }
    if (((local_649 ^ 0xffU) & 1) != 0) {
      FormatString<char[10],char_const*,char[9],char_const*,char[11]>
                ((string *)local_568,(Diligent *)"Missing \'",(char (*) [10])&local_540,
                 (char **)"\' after ",
                 (char (*) [9])(ProcessComputeShaderArguments::DirNames + local_4ec),
                 (char **)" direction",(char (*) [11])in_stack_fffffffffffff928);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_588,this,&local_358,4);
      in_stack_fffffffffffff928 = &local_588;
      Prologue = (String *)local_568;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcd0,Prologue,(char (*) [2])0x46b1a3,in_stack_fffffffffffff928);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)local_568);
    }
  }
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_3f8);
  pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                     ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)Params_local);
  std::__cxx11::string::operator=((string *)&pHVar5->Delimiter,(string *)&pHVar4->Delimiter);
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_590,&local_3f8);
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_598,(iterator *)Params_local);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::erase
            (&this->m_Tokens,local_590,local_598);
  poVar6 = std::operator<<(local_1a8,"layout ( local_size_x = ");
  poVar6 = std::operator<<(poVar6,local_4e8);
  poVar6 = std::operator<<(poVar6,", local_size_y = ");
  poVar6 = std::operator<<(poVar6,(string *)(CSGroupSize[0].field_2._M_local_buf + 8));
  poVar6 = std::operator<<(poVar6,", local_size_z = ");
  poVar6 = std::operator<<(poVar6,(string *)(CSGroupSize[1].field_2._M_local_buf + 8));
  std::operator<<(poVar6," ) in;\n");
  this_00 = GlobalVariables_local;
  __end1 = std::
           vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
           ::begin((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    *)GlobalVariables_local);
  Param = (ShaderParameterInfo *)
          std::
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          ::end((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                                     *)&Param), bVar2) {
    local_5c0 = __gnu_cxx::
                __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                ::operator*(&__end1);
    if (local_5c0->storageQualifier == In) {
      psStack_5c8 = (stringstream *)local_340;
      ArgHandler.PrologueSS = psStack_5c8;
      ArgHandler.this = this;
      local_5d0 = this;
      ProcessShaderArgument<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessComputeShaderArguments(std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>&,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>&,std::__cxx11::string&,std::__cxx11::string&)::__0>
                (this,local_5c0,5,0,psStack_5c8,ArgHandler);
    }
    else if (local_5c0->storageQualifier == Out) {
      LogError<true,char[52]>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcf6,(char (*) [52])"Output variables are not allowed in compute shaders");
    }
    __gnu_cxx::
    __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)Prologue_local,local_5f0);
  std::__cxx11::string::~string(local_5f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)local_30,local_610);
  std::__cxx11::string::~string(local_610);
  local_6a0 = (string *)(CSGroupSize[2].field_2._M_local_buf + 8);
  do {
    local_6a0 = local_6a0 + -0x20;
    std::__cxx11::string::~string(local_6a0);
  } while (local_6a0 != local_4e8);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessComputeShaderArguments(TokenListType::iterator&          TypeToken,
                                                                             std::vector<ShaderParameterInfo>& Params,
                                                                             String&                           GlobalVariables,
                                                                             String&                           Prologue)
{
    stringstream GlobalVarsSS, PrologueSS;

    auto Token = TypeToken;
    //[numthreads(16,16,1)]
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    //^
    --Token;
    //[numthreads(16,16,1)]
    //                    ^
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.begin() && Token->Type == TokenType::ClosingSquareBracket, "Missing numthreads declaration");

    while (Token != m_Tokens.begin() && Token->Type != TokenType::OpenSquareBracket)
        --Token;
    //[numthreads(16,16,1)]
    //^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.begin(), "Missing numthreads() declaration");
    auto OpenStapleToken = Token;

    ++Token;
    //[numthreads(16,16,1)]
    // ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::Identifier && Token->Literal == "numthreads",
                        "Missing numthreads() declaration");

    ++Token;
    //[numthreads(16,16,1)]
    //           ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::OpenParen,
                        "Missing \'(\' after numthreads");

    String             CSGroupSize[3] = {};
    static const Char* DirNames[]     = {"X", "Y", "Z"};
    for (int i = 0; i < 3; ++i)
    {
        ++Token;
        //[numthreads(16,16,1)]
        //            ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && (Token->Type == TokenType::NumericConstant || Token->Type == TokenType::Identifier),
                            "Missing group size for ", DirNames[i], " direction");
        CSGroupSize[i] = Token->Literal.c_str();
        ++Token;
        //[numthreads(16,16,1)]
        //              ^    ^
        const Char* ExpectedLiteral = (i < 2) ? "," : ")";
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Literal == ExpectedLiteral,
                            "Missing \'", ExpectedLiteral, "\' after ", DirNames[i], " direction");
    }

    //OpenStapleToken
    //V
    //[numthreads(16,16,1)]
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    //^
    //TypeToken
    TypeToken->Delimiter = OpenStapleToken->Delimiter;
    m_Tokens.erase(OpenStapleToken, TypeToken);
    //
    // void TestCS(uint3 DTid : SV_DispatchThreadID)

    GlobalVarsSS << "layout ( local_size_x = " << CSGroupSize[0]
                 << ", local_size_y = " << CSGroupSize[1] << ", local_size_z = " << CSGroupSize[2] << " ) in;\n";

    for (const auto& Param : Params)
    {
        if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            ProcessShaderArgument(
                Param, CSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.');
                    if (Getter.empty())
                    {
                        LOG_ERROR_AND_THROW("Unexpected input semantic \"", Param.Semantic,
                                            "\". The only allowed semantics for the compute shader inputs are \"SV_DispatchThreadID\", "
                                            "\"SV_GroupID\", \"SV_GroupThreadID\", and \"SV_GroupIndex\".");
                    }
                    PrologueSS << "    " << Getter << '(' << Param.Type << "," << FullParamName << ");\n";
                } //
            );
        }
        else if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Out)
        {
            LOG_ERROR_AND_THROW("Output variables are not allowed in compute shaders");
        }
    }

    GlobalVariables = GlobalVarsSS.str();
    Prologue        = PrologueSS.str();
}